

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O2

void duckdb::LogicalJoin::GetTableReferences
               (LogicalOperator *op,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *bindings)

{
  pointer pCVar1;
  ColumnBinding binding;
  vector<duckdb::ColumnBinding,_true> column_bindings;
  value_type local_48;
  idx_t iStack_40;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_38;
  
  (*op->_vptr_LogicalOperator[2])(&local_38,op);
  for (pCVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
      pCVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    local_48 = pCVar1->table_index;
    iStack_40 = pCVar1->column_index;
    ::std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)bindings,&local_48);
  }
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void LogicalJoin::GetTableReferences(LogicalOperator &op, unordered_set<idx_t> &bindings) {
	auto column_bindings = op.GetColumnBindings();
	for (auto binding : column_bindings) {
		bindings.insert(binding.table_index);
	}
}